

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aria.c
# Opt level: O0

void aria_cbc_encrypt(uchar *in,uchar *out,size_t len,ARIA_KEY *key,uchar *ivec,int enc)

{
  uchar *in_RCX;
  void *in_RDX;
  size_t in_RSI;
  uchar *in_RDI;
  block128_f in_R8;
  int in_R9D;
  uchar *unaff_retaddr;
  uchar *in_stack_00000038;
  uchar *in_stack_00000040;
  
  if (in_R9D == 0) {
    CRYPTO_cbc128_decrypt
              (in_stack_00000040,in_stack_00000038,(size_t)in,out,(uchar *)len,(block128_f)key);
  }
  else {
    CRYPTO_cbc128_encrypt(unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  }
  return;
}

Assistant:

static void aria_cbc_encrypt(const unsigned char *in, unsigned char *out,
                             size_t len, const ARIA_KEY *key,
                             unsigned char *ivec, const int enc)
{

    if (enc)
        CRYPTO_cbc128_encrypt(in, out, len, key, ivec,
                              (block128_f) ossl_aria_encrypt);
    else
        CRYPTO_cbc128_decrypt(in, out, len, key, ivec,
                              (block128_f) ossl_aria_encrypt);
}